

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O3

void __thiscall re2::Regexp::Walker<re2::Frag>::Walker(Walker<re2::Frag> *this)

{
  _Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_> *this_00;
  
  this->_vptr_Walker = (_func_int **)&PTR__Walker_005ce9b0;
  this_00 = (_Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_> *)
            operator_new(0x50);
  (this_00->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_map_size = 0;
  (this_00->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>::
  _M_initialize_map(this_00,0);
  this->stack_ = (stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
                  *)this_00;
  this->stopped_early_ = false;
  return;
}

Assistant:

Regexp::Walker<T>::Walker() {
  stack_ = new std::stack<WalkState<T> >;
  stopped_early_ = false;
}